

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_resample.c
# Opt level: O3

t_int * upsampling_perform_0(t_int *w)

{
  long lVar1;
  t_int tVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  undefined4 *__s;
  
  lVar1 = w[1];
  __s = (undefined4 *)w[2];
  tVar2 = w[3];
  iVar5 = (int)w[4];
  uVar3 = iVar5 * (int)tVar2;
  if (uVar3 != 0) {
    memset(__s,0,(ulong)uVar3 << 2);
  }
  if (iVar5 != 0) {
    lVar4 = 0;
    do {
      *__s = *(undefined4 *)(lVar1 + lVar4 * 4);
      lVar4 = lVar4 + 1;
      __s = __s + (int)tVar2;
    } while (iVar5 != (int)lVar4);
  }
  return w + 5;
}

Assistant:

t_int *upsampling_perform_0(t_int *w)
{
  t_sample *in  = (t_sample *)(w[1]); /* original signal     */
  t_sample *out = (t_sample *)(w[2]); /* upsampled signal    */
  int up       = (int)(w[3]);       /* upsampling factor   */
  int parent   = (int)(w[4]);       /* original vectorsize */

  int n=parent*up;
  t_sample *dummy = out;

  while(n--)*out++=0;

  n = parent;
  out = dummy;
  while(n--){
    *out=*in++;
    out+=up;
  }

  return (w+5);
}